

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_used_labels.cc
# Opt level: O0

void __thiscall
re2c::Go::used_labels
          (Go *this,
          set<re2c::label_t,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_> *used)

{
  set<re2c::label_t,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_> *used_local;
  Go *this_local;
  
  switch(this->type) {
  case EMPTY:
  case DOT:
    break;
  case SWITCH_IF:
    SwitchIf::used_labels((this->info).switchif,used);
    break;
  case BITMAP:
    GoBitmap::used_labels((this->info).bitmap,used);
    break;
  case CPGOTO:
    Cpgoto::used_labels((this->info).cpgoto,used);
  }
  return;
}

Assistant:

void Go::used_labels (std::set<label_t> & used)
{
	switch (type)
	{
		case EMPTY:
		case DOT:
			break;
		case SWITCH_IF:
			info.switchif->used_labels (used);
			break;
		case BITMAP:
			info.bitmap->used_labels (used);
			break;
		case CPGOTO:
			info.cpgoto->used_labels (used);
			break;
	}
}